

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_type_safe::noflag_t_&,_const_type_safe::flag_set<test_flags>_&> * __thiscall
Catch::ExprLhs<type_safe::noflag_t_const&>::operator==
          (BinaryExpr<const_type_safe::noflag_t_&,_const_type_safe::flag_set<test_flags>_&>
           *__return_storage_ptr__,ExprLhs<type_safe::noflag_t_const&> *this,
          flag_set<test_flags> *rhs)

{
  noflag_t *lhs;
  bool comparisonResult;
  StringRef local_30;
  flag_set<test_flags> *local_20;
  flag_set<test_flags> *rhs_local;
  ExprLhs<const_type_safe::noflag_t_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (flag_set<test_flags> *)this;
  this_local = (ExprLhs<const_type_safe::noflag_t_&> *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<type_safe::noflag_t,type_safe::flag_set<test_flags>>(*(noflag_t **)this,rhs);
  lhs = *(noflag_t **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_type_safe::noflag_t_&,_const_type_safe::flag_set<test_flags>_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }